

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::setNewWindowTitle(QMdiSubWindowPrivate *this)

{
  long lVar1;
  QWidget *pQVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QString local_a0;
  type local_88;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowTitle(&local_48,pQVar2);
  if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    originalWindowTitle(&local_68,this);
    if ((undefined1 *)local_68.d.size == (undefined1 *)0x0) {
      this->ignoreWindowTitleChange = true;
      pQVar2 = QWidget::window(pQVar2);
      QWidget::setWindowTitle(pQVar2,&local_48);
      this->ignoreWindowTitleChange = false;
    }
    else {
      QMetaObject::tr((char *)&local_a0,(char *)&QMdiSubWindow::staticMetaObject,0x6daeed);
      QVar3.m_size = (size_t)&local_a0;
      QVar3.field_0.m_data = &local_88;
      QString::arg_impl(QVar3,(int)local_48.d.ptr,(QChar)(char16_t)local_48.d.size);
      lVar1 = QString::indexOf((QString *)&local_68,(longlong)&local_88,CaseInsensitive);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (lVar1 == -1) {
        local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::tr((char *)&local_a0,(char *)&QMdiSubWindow::staticMetaObject,0x6daef4);
        QString::arg<QString&,QString&>(&local_88,&local_a0,&local_68,&local_48);
        if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
          }
        }
        this->ignoreWindowTitleChange = true;
        pQVar2 = QWidget::window(pQVar2);
        QWidget::setWindowTitle(pQVar2,&local_88);
        this->ignoreWindowTitleChange = false;
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setNewWindowTitle()
{
    Q_Q(QMdiSubWindow);
    QString childTitle = q->windowTitle();
    if (childTitle.isEmpty())
        return;
    QString original = originalWindowTitle();
    if (!original.isEmpty()) {
        if (!original.contains(QMdiSubWindow::tr("- [%1]").arg(childTitle))) {
            auto title = QMdiSubWindow::tr("%1 - [%2]").arg(original, childTitle);
            ignoreWindowTitleChange = true;
            q->window()->setWindowTitle(title);
            ignoreWindowTitleChange = false;
        }

    } else {
        ignoreWindowTitleChange = true;
        q->window()->setWindowTitle(childTitle);
        ignoreWindowTitleChange = false;
    }
}